

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

EVaction old_EVassoc_filter_action
                   (CManager cm,EVstone stone,CMFormatList format_list,EVSimpleHandlerFunc handler,
                   EVstone out_stone,void *client_data)

{
  int iVar1;
  EVaction EVar2;
  EVSimpleHandlerFunc handler_00;
  CManager_conflict in_RCX;
  long in_RDX;
  EVstone in_R8D;
  FMStructDescList in_R9;
  int i;
  int count;
  FMStructDescList structs;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar4;
  int out_stone_00;
  
  out_stone_00 = 0;
  while( true ) {
    uVar3 = false;
    if (in_RDX != 0) {
      uVar3 = *(long *)(in_RDX + (long)out_stone_00 * 0x10) != 0;
    }
    if ((bool)uVar3 == false) break;
    out_stone_00 = out_stone_00 + 1;
  }
  handler_00 = (EVSimpleHandlerFunc)INT_CMmalloc(CONCAT44(out_stone_00,in_stack_ffffffffffffffc0));
  for (iVar4 = 0; iVar4 < out_stone_00; iVar4 = iVar4 + 1) {
    *(undefined8 *)(handler_00 + (long)iVar4 * 0x20) = *(undefined8 *)(in_RDX + (long)iVar4 * 0x10);
    *(undefined8 *)(handler_00 + (long)iVar4 * 0x20 + 8) =
         *(undefined8 *)(in_RDX + (long)iVar4 * 0x10 + 8);
    iVar1 = struct_size_field_list((FMFieldList)in_R9,(int)((ulong)handler_00 >> 0x20));
    *(int *)(handler_00 + (long)iVar4 * 0x20 + 0x10) = iVar1;
    *(undefined8 *)(handler_00 + (long)iVar4 * 0x20 + 0x18) = 0;
  }
  *(undefined8 *)(handler_00 + (long)out_stone_00 * 0x20) = 0;
  *(undefined8 *)(handler_00 + (long)out_stone_00 * 0x20 + 8) = 0;
  EVar2 = EVassoc_filter_action
                    (in_RCX,in_R8D,in_R9,handler_00,out_stone_00,
                     (void *)CONCAT17(uVar3,in_stack_ffffffffffffffb8));
  return EVar2;
}

Assistant:

extern EVaction
old_EVassoc_filter_action(CManager cm, EVstone stone, CMFormatList format_list, 
			EVSimpleHandlerFunc handler, EVstone out_stone, void* client_data)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVassoc_filter_action(cm, stone, structs, handler, out_stone, client_data);
}